

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O3

void ut::
     are_equal<agge::tests::mocks::coords_pair<int>,2ul,std::vector<agge::tests::mocks::coords_pair<int>,std::allocator<agge::tests::mocks::coords_pair<int>>>>
               (coords_pair<int> (*expected) [2],
               vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
               *actual,LocationInfo *location)

{
  pointer pcVar1;
  FailedAssertion *pFVar2;
  long lVar3;
  string local_40;
  
  pcVar1 = (actual->
           super__Vector_base<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(actual->
            super__Vector_base<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 != 0x20) {
    pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
    __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  lVar3 = 0;
  while ((((*(int *)((long)&(*expected)[0].x1 + lVar3) == *(int *)((long)&pcVar1->x1 + lVar3) &&
           (*(int *)((long)&(*expected)[0].y1 + lVar3) == *(int *)((long)&pcVar1->y1 + lVar3))) &&
          (*(int *)((long)&(*expected)[0].x2 + lVar3) == *(int *)((long)&pcVar1->x2 + lVar3))) &&
         (*(int *)((long)&(*expected)[0].y2 + lVar3) == *(int *)((long)&pcVar1->y2 + lVar3)))) {
    lVar3 = lVar3 + 0x10;
    if (lVar3 == 0x20) {
      return;
    }
  }
  pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
  __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}